

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cipher.c
# Opt level: O3

int mbedtls_cipher_update
              (mbedtls_cipher_context_t *ctx,uchar *input,size_t ilen,uchar *output,size_t *olen)

{
  mbedtls_cipher_mode_t mVar1;
  int iVar2;
  ulong uVar3;
  size_t sVar4;
  size_t sVar5;
  mbedtls_cipher_info_t *pmVar6;
  
  if (ctx == (mbedtls_cipher_context_t *)0x0) {
    return -0x6100;
  }
  pmVar6 = ctx->cipher_info;
  if (olen == (size_t *)0x0 || pmVar6 == (mbedtls_cipher_info_t *)0x0) {
    return -0x6100;
  }
  *olen = 0;
  mVar1 = pmVar6->mode;
  if (mVar1 == MBEDTLS_MODE_GCM) {
    *olen = ilen;
    iVar2 = mbedtls_gcm_update((mbedtls_gcm_context *)ctx->cipher_ctx,ilen,input,output);
    return iVar2;
  }
  if (mVar1 == MBEDTLS_MODE_ECB) {
    if (pmVar6->block_size != ilen) {
      return -0x6280;
    }
    *olen = ilen;
    iVar2 = (*pmVar6->base->ecb_func)(ctx->cipher_ctx,ctx->operation,input,output);
    return iVar2;
  }
  if (input == output) {
    if (ctx->unprocessed_len != 0) {
      return -0x6100;
    }
    if (ilen % (ulong)pmVar6->block_size != 0) {
      return -0x6100;
    }
  }
  iVar2 = -0x6080;
  switch(mVar1) {
  case MBEDTLS_MODE_CBC:
    sVar4 = ctx->unprocessed_len;
    if (ctx->operation == MBEDTLS_ENCRYPT) {
      if ((ulong)pmVar6->block_size <= sVar4 + ilen) goto LAB_001571b8;
LAB_001572dd:
      memcpy(ctx->unprocessed_data + sVar4,input,ilen);
      ctx->unprocessed_len = ctx->unprocessed_len + ilen;
    }
    else {
      if ((ctx->operation == MBEDTLS_DECRYPT) && (sVar4 + ilen <= (ulong)pmVar6->block_size))
      goto LAB_001572dd;
LAB_001571b8:
      if (sVar4 != 0) {
        sVar5 = pmVar6->block_size - sVar4;
        memcpy(ctx->unprocessed_data + sVar4,input,sVar5);
        iVar2 = (*ctx->cipher_info->base->cbc_func)
                          (ctx->cipher_ctx,ctx->operation,(size_t)ctx->cipher_info->block_size,
                           ctx->iv,ctx->unprocessed_data,output);
        if (iVar2 != 0) {
          return iVar2;
        }
        pmVar6 = ctx->cipher_info;
        if (pmVar6 == (mbedtls_cipher_info_t *)0x0) {
          sVar4 = *olen;
          uVar3 = 0;
        }
        else {
          uVar3 = (ulong)pmVar6->block_size;
          sVar4 = *olen + uVar3;
        }
        *olen = sVar4;
        output = output + uVar3;
        ctx->unprocessed_len = 0;
        input = input + sVar5;
        ilen = ilen - sVar5;
      }
      if (ilen != 0) {
        if (pmVar6 == (mbedtls_cipher_info_t *)0x0) {
          uVar3 = 0;
        }
        else {
          uVar3 = (ulong)pmVar6->block_size;
        }
        sVar5 = ilen % uVar3;
        if (((sVar5 == 0) && (sVar5 = 0, pmVar6 != (mbedtls_cipher_info_t *)0x0)) &&
           (ctx->operation == MBEDTLS_DECRYPT)) {
          sVar5 = (size_t)pmVar6->block_size;
        }
        memcpy(ctx->unprocessed_data,input + (ilen - sVar5),sVar5);
        ctx->unprocessed_len = ctx->unprocessed_len + sVar5;
        sVar4 = ilen - sVar5;
        if (sVar4 == 0) {
          return 0;
        }
        iVar2 = (*pmVar6->base->cbc_func)(ctx->cipher_ctx,ctx->operation,sVar4,ctx->iv,input,output)
        ;
        if (iVar2 != 0) {
          return iVar2;
        }
        *olen = *olen + sVar4;
        return 0;
      }
    }
    goto LAB_00157321;
  case MBEDTLS_MODE_CFB:
    iVar2 = (*pmVar6->base->cfb_func)
                      (ctx->cipher_ctx,ctx->operation,ilen,&ctx->unprocessed_len,ctx->iv,input,
                       output);
    break;
  default:
    goto switchD_0015718e_caseD_4;
  case MBEDTLS_MODE_CTR:
    iVar2 = (*pmVar6->base->ctr_func)
                      (ctx->cipher_ctx,ilen,&ctx->unprocessed_len,ctx->iv,ctx->unprocessed_data,
                       input,output);
    break;
  case MBEDTLS_MODE_STREAM:
    iVar2 = (*pmVar6->base->stream_func)(ctx->cipher_ctx,ilen,input,output);
  }
  if (iVar2 == 0) {
    *olen = ilen;
LAB_00157321:
    iVar2 = 0;
  }
switchD_0015718e_caseD_4:
  return iVar2;
}

Assistant:

int mbedtls_cipher_update( mbedtls_cipher_context_t *ctx, const unsigned char *input,
                   size_t ilen, unsigned char *output, size_t *olen )
{
    int ret;

    if( NULL == ctx || NULL == ctx->cipher_info || NULL == olen )
    {
        return( MBEDTLS_ERR_CIPHER_BAD_INPUT_DATA );
    }

    *olen = 0;

    if( ctx->cipher_info->mode == MBEDTLS_MODE_ECB )
    {
        if( ilen != mbedtls_cipher_get_block_size( ctx ) )
            return( MBEDTLS_ERR_CIPHER_FULL_BLOCK_EXPECTED );

        *olen = ilen;

        if( 0 != ( ret = ctx->cipher_info->base->ecb_func( ctx->cipher_ctx,
                    ctx->operation, input, output ) ) )
        {
            return( ret );
        }

        return( 0 );
    }

#if defined(MBEDTLS_GCM_C)
    if( ctx->cipher_info->mode == MBEDTLS_MODE_GCM )
    {
        *olen = ilen;
        return mbedtls_gcm_update( (mbedtls_gcm_context *) ctx->cipher_ctx, ilen, input,
                           output );
    }
#endif

    if( input == output &&
       ( ctx->unprocessed_len != 0 || ilen % mbedtls_cipher_get_block_size( ctx ) ) )
    {
        return( MBEDTLS_ERR_CIPHER_BAD_INPUT_DATA );
    }

#if defined(MBEDTLS_CIPHER_MODE_CBC)
    if( ctx->cipher_info->mode == MBEDTLS_MODE_CBC )
    {
        size_t copy_len = 0;

        /*
         * If there is not enough data for a full block, cache it.
         */
        if( ( ctx->operation == MBEDTLS_DECRYPT &&
                ilen + ctx->unprocessed_len <= mbedtls_cipher_get_block_size( ctx ) ) ||
             ( ctx->operation == MBEDTLS_ENCRYPT &&
                ilen + ctx->unprocessed_len < mbedtls_cipher_get_block_size( ctx ) ) )
        {
            memcpy( &( ctx->unprocessed_data[ctx->unprocessed_len] ), input,
                    ilen );

            ctx->unprocessed_len += ilen;
            return( 0 );
        }

        /*
         * Process cached data first
         */
        if( ctx->unprocessed_len != 0 )
        {
            copy_len = mbedtls_cipher_get_block_size( ctx ) - ctx->unprocessed_len;

            memcpy( &( ctx->unprocessed_data[ctx->unprocessed_len] ), input,
                    copy_len );

            if( 0 != ( ret = ctx->cipher_info->base->cbc_func( ctx->cipher_ctx,
                    ctx->operation, mbedtls_cipher_get_block_size( ctx ), ctx->iv,
                    ctx->unprocessed_data, output ) ) )
            {
                return( ret );
            }

            *olen += mbedtls_cipher_get_block_size( ctx );
            output += mbedtls_cipher_get_block_size( ctx );
            ctx->unprocessed_len = 0;

            input += copy_len;
            ilen -= copy_len;
        }

        /*
         * Cache final, incomplete block
         */
        if( 0 != ilen )
        {
            copy_len = ilen % mbedtls_cipher_get_block_size( ctx );
            if( copy_len == 0 && ctx->operation == MBEDTLS_DECRYPT )
                copy_len = mbedtls_cipher_get_block_size( ctx );

            memcpy( ctx->unprocessed_data, &( input[ilen - copy_len] ),
                    copy_len );

            ctx->unprocessed_len += copy_len;
            ilen -= copy_len;
        }

        /*
         * Process remaining full blocks
         */
        if( ilen )
        {
            if( 0 != ( ret = ctx->cipher_info->base->cbc_func( ctx->cipher_ctx,
                    ctx->operation, ilen, ctx->iv, input, output ) ) )
            {
                return( ret );
            }

            *olen += ilen;
        }

        return( 0 );
    }
#endif /* MBEDTLS_CIPHER_MODE_CBC */

#if defined(MBEDTLS_CIPHER_MODE_CFB)
    if( ctx->cipher_info->mode == MBEDTLS_MODE_CFB )
    {
        if( 0 != ( ret = ctx->cipher_info->base->cfb_func( ctx->cipher_ctx,
                ctx->operation, ilen, &ctx->unprocessed_len, ctx->iv,
                input, output ) ) )
        {
            return( ret );
        }

        *olen = ilen;

        return( 0 );
    }
#endif /* MBEDTLS_CIPHER_MODE_CFB */

#if defined(MBEDTLS_CIPHER_MODE_CTR)
    if( ctx->cipher_info->mode == MBEDTLS_MODE_CTR )
    {
        if( 0 != ( ret = ctx->cipher_info->base->ctr_func( ctx->cipher_ctx,
                ilen, &ctx->unprocessed_len, ctx->iv,
                ctx->unprocessed_data, input, output ) ) )
        {
            return( ret );
        }

        *olen = ilen;

        return( 0 );
    }
#endif /* MBEDTLS_CIPHER_MODE_CTR */

#if defined(MBEDTLS_CIPHER_MODE_STREAM)
    if( ctx->cipher_info->mode == MBEDTLS_MODE_STREAM )
    {
        if( 0 != ( ret = ctx->cipher_info->base->stream_func( ctx->cipher_ctx,
                                                    ilen, input, output ) ) )
        {
            return( ret );
        }

        *olen = ilen;

        return( 0 );
    }
#endif /* MBEDTLS_CIPHER_MODE_STREAM */

    return( MBEDTLS_ERR_CIPHER_FEATURE_UNAVAILABLE );
}